

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

int tlstran_ep_bind(void *arg,nng_url *url)

{
  int local_28;
  int local_24;
  int port;
  int rv;
  tlstran_ep *ep;
  nng_url *url_local;
  void *arg_local;
  
  _port = (nni_mtx *)arg;
  ep = (tlstran_ep *)url;
  url_local = (nng_url *)arg;
  nni_mtx_lock((nni_mtx *)arg);
  local_24 = nng_stream_listener_listen(*(nng_stream_listener **)((long)&_port[2].mtx + 0x10));
  if (local_24 == 0) {
    nng_stream_listener_get_int
              (*(nng_stream_listener **)((long)&_port[2].mtx + 0x10),"tcp-bound-port",&local_28);
    *(int *)((long)&(ep->mtx).mtx + 0x18) = local_28;
  }
  nni_mtx_unlock(_port);
  return local_24;
}

Assistant:

static int
tlstran_ep_bind(void *arg, nng_url *url)
{
	tlstran_ep *ep = arg;
	int         rv;

	nni_mtx_lock(&ep->mtx);
	rv = nng_stream_listener_listen(ep->listener);
	if (rv == 0) {
		int port;
		nng_stream_listener_get_int(
		    ep->listener, NNG_OPT_TCP_BOUND_PORT, &port);
		url->u_port = (uint32_t) port;
	}
	nni_mtx_unlock(&ep->mtx);

	return (rv);
}